

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ancientzip.cpp
# Opt level: O1

int ShrinkLoop(uchar *out,uint outsize,FileReader *In,uint InLeft)

{
  byte *pbVar1;
  undefined1 uVar2;
  undefined1 *puVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ushort uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uchar ReadBuf [256];
  unsigned_short Parent [8192];
  uchar Stack [8192];
  uchar Value [8192];
  int local_8160;
  uint local_815c;
  byte local_8138 [256];
  undefined2 uStack_8038;
  ushort local_8036 [256];
  ushort local_7e36 [12030];
  undefined1 local_203a;
  undefined1 local_2039;
  undefined1 auStack_2038 [8200];
  
  lVar5 = 0;
  do {
    auStack_2038[lVar5] = (char)lVar5;
    local_8036[lVar5 + -1] = 0x100;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  lVar5 = 0x101;
  do {
    local_8036[lVar5 + -1] = 0x2000;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x2000);
  uVar4 = 0;
  uVar10 = 0;
  uVar22 = 0;
  iVar12 = 0;
  do {
    if (InLeft == 0) {
      InLeft = 0;
      bVar6 = 0;
    }
    else {
      InLeft = InLeft - 1;
      if (uVar10 < uVar4) {
        uVar9 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
        bVar6 = local_8138[uVar9];
      }
      else {
        uVar4 = (*(In->super_FileReaderBase)._vptr_FileReaderBase[2])(In,local_8138,0x100);
        uVar10 = 1;
        bVar6 = local_8138[0];
      }
    }
    uVar22 = uVar22 + ((uint)bVar6 << ((byte)iVar12 & 0x1f));
    iVar12 = iVar12 + 8;
  } while (iVar12 == 8);
  if (outsize != 0) {
    *out = (uchar)uVar22;
  }
  uVar11 = (uint)(outsize != 0);
  if (uVar11 < outsize) {
    local_815c = uVar22 & 0x1ff;
    uVar22 = uVar22 >> 9;
    local_8160 = 0x100;
    uVar21 = 7;
    uVar19 = 9;
    do {
      bVar6 = (byte)uVar19;
      uVar15 = ~(-1 << (bVar6 & 0x1f));
      while( true ) {
        for (; uVar21 < uVar19; uVar21 = uVar21 + 8) {
          if (InLeft == 0) {
            InLeft = 0;
            bVar7 = 0;
          }
          else {
            InLeft = InLeft - 1;
            if (uVar10 < uVar4) {
              uVar9 = (ulong)uVar10;
              uVar10 = uVar10 + 1;
              bVar7 = local_8138[uVar9];
            }
            else {
              uVar4 = (*(In->super_FileReaderBase)._vptr_FileReaderBase[2])(In,local_8138,0x100);
              uVar10 = 1;
              bVar7 = local_8138[0];
            }
          }
          bVar8 = (byte)uVar21;
          uVar22 = uVar22 + ((uint)bVar7 << (bVar8 & 0x1f));
        }
        uVar23 = uVar22 >> (bVar6 & 0x1f);
        uVar13 = uVar22 & uVar15;
        uVar21 = uVar21 - uVar19;
        if (uVar13 == 0x100) break;
        uVar14 = local_8036[(ulong)uVar13 - 1];
        uVar22 = uVar13;
        puVar3 = &local_2039;
        if (uVar14 == 0x2000) {
          uVar22 = local_815c;
          puVar3 = &local_203a;
        }
        lVar5 = 0;
        lVar16 = -1;
        do {
          lVar17 = lVar16;
          lVar18 = lVar5;
          uVar2 = auStack_2038[(int)uVar22];
          puVar3[lVar18] = uVar2;
          uVar22 = local_8036[(long)(int)uVar22 + -1] & 0x1fff;
          lVar5 = lVar18 + -1;
          lVar16 = lVar17 + -1;
        } while (uVar22 != 0x100);
        if (uVar14 == 0x2000) {
          local_2039 = uVar2;
        }
        lVar16 = (long)local_8160;
        lVar5 = 0;
        do {
          lVar20 = lVar5;
          lVar5 = lVar20 + 1;
        } while (local_7e36[lVar16 + lVar20 + -0x100] != 0x2000);
        local_8036[lVar16 + lVar20] = (ushort)local_815c;
        auStack_2038[lVar5 + lVar16] = puVar3[lVar18];
        do {
          uVar9 = (ulong)uVar11;
          uVar11 = uVar11 + 1;
          out[uVar9] = puVar3[lVar17 + 1];
          lVar17 = lVar17 + 1;
        } while ((uint)(uVar14 == 0x2000) != (uint)lVar17);
        local_8160 = local_8160 + (int)lVar5;
        uVar22 = uVar23;
        local_815c = uVar13;
        if (outsize <= uVar11) {
          return 0;
        }
      }
      for (; uVar21 < uVar19; uVar21 = uVar21 + 8) {
        if (InLeft == 0) {
          InLeft = 0;
          bVar7 = 0;
        }
        else {
          InLeft = InLeft - 1;
          if (uVar10 < uVar4) {
            uVar9 = (ulong)uVar10;
            uVar10 = uVar10 + 1;
            bVar7 = local_8138[uVar9];
          }
          else {
            uVar4 = (*(In->super_FileReaderBase)._vptr_FileReaderBase[2])(In,local_8138,0x100);
            uVar10 = 1;
            bVar7 = local_8138[0];
          }
        }
        uVar23 = uVar23 + ((uint)bVar7 << ((byte)uVar21 & 0x1f));
      }
      uVar15 = uVar15 & uVar23;
      uVar22 = uVar23 >> (bVar6 & 0x1f);
      if (uVar15 == 1) {
        uVar23 = uVar19 + 1;
      }
      else {
        uVar23 = uVar19;
        if (uVar15 == 2) {
          lVar5 = 0x101;
          do {
            if (0x100 < (local_8036[lVar5 + -1] & 0x1fff)) {
              pbVar1 = (byte *)((long)local_8036 + (ulong)(local_8036[lVar5 + -1] & 0x1fff) * 2 + -1
                               );
              *pbVar1 = *pbVar1 | 0x40;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x2000);
          lVar5 = 0x101;
          do {
            uVar14 = local_8036[lVar5 + -1] & 0xbfff;
            if ((local_8036[lVar5 + -1] >> 0xe & 1) == 0) {
              uVar14 = 0x2000;
            }
            local_8036[lVar5 + -1] = uVar14;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x2000);
          local_8160 = 0x100;
        }
      }
      uVar21 = uVar21 - uVar19;
      uVar19 = uVar23;
    } while (uVar11 < outsize);
  }
  return 0;
}

Assistant:

int ShrinkLoop(unsigned char *out, unsigned int outsize,
			   FileReader *In, unsigned int InLeft)
{
	unsigned char ReadBuf[256];
	unsigned short Parent[HSIZE];
	unsigned char Value[HSIZE], Stack[HSIZE];
	unsigned char *newstr;
	int len;
	int KwKwK, codesize = 9;	/* start at 9 bits/code */
	int code, oldcode, freecode, curcode;
	unsigned int Bits = 0, Hold = 0;
	unsigned int size = 0;
	unsigned int bs = 0, be = 0;

	freecode = BOGUSCODE;
	for (code = 0; code < BOGUSCODE; code++)
	{
		Value[code] = code;
		Parent[code] = BOGUSCODE;
	}
	for (code = BOGUSCODE+1; code < HSIZE; code++)
		Parent[code] = FREE_CODE;

	READBITS(oldcode, codesize);
	if (size < outsize) {
		out[size++] = oldcode;
	}

	while (size < outsize)
	{
		READBITS(code, codesize);
		if (code == BOGUSCODE) {	/* possible to have consecutive escapes? */
			READBITS(code, codesize);
			if (code == 1) {
				codesize++;
			} else if (code == 2) {
				/* clear leafs (nodes with no children) */
				/* first loop:  mark each parent as such */
				for (code = BOGUSCODE+1;  code < HSIZE;  ++code) {
					curcode = (Parent[code] & CODE_MASK);

					if (curcode > BOGUSCODE)
						Parent[curcode] |= HAS_CHILD;		/* set parent's child-bit */
				}

				/* second loop:  clear all nodes *not* marked as parents; reset flag bits */
				for (code = BOGUSCODE+1;  code < HSIZE;  ++code) {
					if (Parent[code] & HAS_CHILD) {		/* just clear child-bit */
						Parent[code] &= ~HAS_CHILD;
					} else {							/* leaf:  lose it */
						Parent[code] = FREE_CODE;
					}
				}
				freecode = BOGUSCODE;
			}
			continue;
		}

		newstr = &Stack[HSIZE-1];
		curcode = code;

		if (Parent[curcode] == FREE_CODE) {
			KwKwK = 1;
			newstr--;	/* last character will be same as first character */
			curcode = oldcode;
			len = 1;
		} else {
			KwKwK = 0;
			len = 0;
		}

		do {
			*newstr-- = Value[curcode];
			len++;
			curcode = (Parent[curcode] & CODE_MASK);
		} while (curcode != BOGUSCODE);

		newstr++;
		if (KwKwK) {
			Stack[HSIZE-1] = *newstr;
		}

		do {
			freecode++;
		} while (Parent[freecode] != FREE_CODE);

		Parent[freecode] = oldcode;
		Value[freecode] = *newstr;
		oldcode = code;

		while (len--) {
			out[size++] = *newstr++;
		}
	}
	return 0;
}